

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getDefaultRuleSetName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this)

{
  NFRuleSet *pNVar1;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b2258;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  pNVar1 = this->defaultRuleSet;
  if ((pNVar1 == (NFRuleSet *)0x0) || (pNVar1->fIsPublic == '\0')) {
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  else {
    UnicodeString::copyFrom(__return_storage_ptr__,&pNVar1->name,'\0');
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
RuleBasedNumberFormat::getDefaultRuleSetName() const {
    UnicodeString result;
    if (defaultRuleSet && defaultRuleSet->isPublic()) {
        defaultRuleSet->getName(result);
    } else {
        result.setToBogus();
    }
    return result;
}